

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<double,double>(Thread *this,UnopFunc<double,_double> *f)

{
  Simd<double,_(unsigned_char)__x02_> value;
  double *__first;
  double *__last;
  double *__result;
  double local_38;
  SR result;
  Simd<double,_(unsigned_char)__x02_> val;
  UnopFunc<double,_double> *f_local;
  Thread *this_local;
  
  join_0x00001240_0x00001200_ = Pop<wabt::interp::Simd<double,(unsigned_char)2>>(this);
  __first = std::begin<double,2ul>((double (*) [2])(result.v + 1));
  __last = std::end<double,2ul>((double (*) [2])(result.v + 1));
  __result = std::begin<double,2ul>((double (*) [2])&local_38);
  std::transform<double*,double*,double(*)(double)>(__first,__last,__result,f);
  value.v[1] = result.v[0];
  value.v[0] = local_38;
  Push<wabt::interp::Simd<double,(unsigned_char)2>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}